

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_columnref_expression.cpp
# Opt level: O2

void __thiscall
duckdb::BoundColumnRefExpression::BoundColumnRefExpression
          (BoundColumnRefExpression *this,LogicalType *type,ColumnBinding binding,idx_t depth)

{
  LogicalType local_60;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_60,type);
  BoundColumnRefExpression(this,&local_48,&local_60,binding,depth);
  LogicalType::~LogicalType(&local_60);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

BoundColumnRefExpression::BoundColumnRefExpression(LogicalType type, ColumnBinding binding, idx_t depth)
    : BoundColumnRefExpression(string(), std::move(type), binding, depth) {
}